

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HBT_correlation.cpp
# Opt level: O0

void __thiscall
HBT_correlation::HBT_correlation
          (HBT_correlation *this,ParameterReader *paraRdr,string *path,
          shared_ptr<RandomUtil::Random> *ran_gen)

{
  string *in_RDX;
  HBT_correlation *in_RDI;
  double dVar1;
  string *name;
  double ******arr5D;
  vector<double,_std::allocator<double>_> *this_00;
  int k_2;
  int j_2;
  int i_5;
  int iphi;
  int iK_2;
  int k_1;
  int j_1;
  int i_4;
  int iK_1;
  int k;
  int iK;
  int j;
  int i_3;
  int i_2;
  int i_1;
  int i;
  undefined4 in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb7c;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffb80;
  ParameterReader *in_stack_fffffffffffffb88;
  HBT_correlation *arr2D;
  int n3;
  ParameterReader *in_stack_fffffffffffffb90;
  HBT_correlation *this_01;
  int n1;
  HBT_correlation *this_02;
  int n5;
  string *in_stack_fffffffffffffbc8;
  ParameterReader *in_stack_fffffffffffffbd0;
  HBT_correlation *this_03;
  int local_2bc;
  int local_2b8;
  int local_2b4;
  int local_2b0;
  int local_2ac;
  int local_2a8;
  int local_2a4;
  int local_2a0;
  int local_29c;
  int local_298;
  int local_294;
  int local_290;
  int local_28c;
  int local_27c;
  int local_250;
  undefined1 local_249 [40];
  allocator local_221;
  string local_220 [39];
  allocator local_1f9;
  string local_1f8 [39];
  allocator local_1d1;
  string local_1d0 [39];
  allocator local_1a9;
  string local_1a8 [39];
  allocator local_181;
  string local_180 [39];
  allocator local_159;
  string local_158 [39];
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [32];
  double local_e8;
  double local_e0;
  double local_d8;
  int local_d0;
  allocator local_c9;
  string local_c8 [39];
  allocator local_a1;
  string local_a0 [39];
  allocator local_79;
  string local_78 [39];
  allocator local_51;
  string local_50 [80];
  
  ParameterReader::ParameterReader(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  std::__cxx11::string::string((string *)&in_RDI->path_,in_RDX);
  std::shared_ptr<particleSamples>::shared_ptr((shared_ptr<particleSamples> *)0x15574b);
  std::shared_ptr<RandomUtil::Random>::shared_ptr((shared_ptr<RandomUtil::Random> *)0x155764);
  pretty_ostream::pretty_ostream((pretty_ostream *)0x15577d);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x15579b);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1557b7);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1557d3);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x1557ef);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x15580b);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x155827);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x155843);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x15585f);
  std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::vector
            ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)0x15587b);
  std::shared_ptr<RandomUtil::Random>::operator=
            ((shared_ptr<RandomUtil::Random> *)in_stack_fffffffffffffb80,
             (shared_ptr<RandomUtil::Random> *)
             CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  in_RDI->long_comoving_boost = false;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"long_comoving_boost",&local_51);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  if ((dVar1 == 1.0) && (!NAN(dVar1))) {
    in_RDI->long_comoving_boost = true;
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,"qnpts",&local_79);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->qnpts = (int)dVar1;
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"q_min",&local_a1);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->q_min = dVar1;
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c8,"q_max",&local_c9);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->q_max = dVar1;
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_c9);
  in_RDI->delta_q = (in_RDI->q_max - in_RDI->q_min) / (double)(in_RDI->qnpts + -1);
  for (local_d0 = 0; local_d0 < in_RDI->qnpts; local_d0 = local_d0 + 1) {
    local_d8 = (double)local_d0 * in_RDI->delta_q + in_RDI->q_min;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffb80,
               (value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    local_e0 = (double)local_d0 * in_RDI->delta_q + in_RDI->q_min;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffb80,
               (value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    local_e8 = (double)local_d0 * in_RDI->delta_q + in_RDI->q_min;
    std::vector<double,_std::allocator<double>_>::push_back
              (in_stack_fffffffffffffb80,
               (value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_108,"needed_number_of_pairs",&local_109);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->needed_number_of_pairs =
       (long)dVar1 | (long)(dVar1 - 9.223372036854776e+18) & (long)dVar1 >> 0x3f;
  std::__cxx11::string::~string(local_108);
  std::allocator<char>::~allocator((allocator<char> *)&local_109);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_130,"azimuthal_flag",&local_131);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->azimuthal_flag_ = (int)dVar1;
  std::__cxx11::string::~string(local_130);
  std::allocator<char>::~allocator((allocator<char> *)&local_131);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_158,"invariant_radius_flag",&local_159);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->invariant_radius_flag_ = (int)dVar1;
  std::__cxx11::string::~string(local_158);
  std::allocator<char>::~allocator((allocator<char> *)&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_180,"n_KT",&local_181);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->n_KT = (int)dVar1;
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator((allocator<char> *)&local_181);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a8,"n_Kphi",&local_1a9);
  dVar1 = ParameterReader::getVal(in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8);
  in_RDI->n_Kphi = (int)dVar1;
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a9);
  this_03 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1d0,"KT_min",&local_1d1);
  name = (string *)ParameterReader::getVal(&this_03->paraRdr_,in_stack_fffffffffffffbc8);
  in_RDI->KT_min = (double)name;
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1f8,"KT_max",&local_1f9);
  dVar1 = ParameterReader::getVal(&this_03->paraRdr_,name);
  in_RDI->KT_max = dVar1;
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator((allocator<char> *)&local_1f9);
  this_02 = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_220,"HBTrap_min",&local_221);
  arr5D = (double ******)ParameterReader::getVal(&this_03->paraRdr_,name);
  in_RDI->Krap_min_ = (double)arr5D;
  std::__cxx11::string::~string(local_220);
  std::allocator<char>::~allocator((allocator<char> *)&local_221);
  this_01 = (HBT_correlation *)local_249;
  arr2D = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)(local_249 + 1),"HBTrap_max",(allocator *)this_01);
  this_00 = (vector<double,_std::allocator<double>_> *)
            ParameterReader::getVal(&this_03->paraRdr_,name);
  in_RDI->Krap_max_ = (double)this_00;
  std::__cxx11::string::~string((string *)(local_249 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_249);
  in_RDI->dKT = (in_RDI->KT_max - in_RDI->KT_min) / (double)(in_RDI->n_KT + -1);
  in_RDI->dKphi = 6.283185307179586 / (double)in_RDI->n_Kphi;
  for (local_250 = 0; local_250 < in_RDI->n_KT; local_250 = local_250 + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_00,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
              );
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_00,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
              );
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_00,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
              );
    std::vector<unsigned_long_long,_std::allocator<unsigned_long_long>_>::push_back
              ((vector<unsigned_long_long,_std::allocator<unsigned_long_long>_> *)this_00,
               (value_type_conflict3 *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78)
              );
  }
  for (local_27c = 0; n5 = SUB84(dVar1,0), local_27c < in_RDI->n_Kphi; local_27c = local_27c + 1) {
    std::vector<double,_std::allocator<double>_>::push_back
              (this_00,(value_type *)CONCAT44(in_stack_fffffffffffffb7c,in_stack_fffffffffffffb78));
  }
  if (in_RDI->azimuthal_flag_ == 1) {
    create_a_2D_array<unsigned_long_long>
              (this_01,(unsigned_long_long ***)arr2D,(int)((ulong)this_00 >> 0x20),(int)this_00);
    create_a_2D_array<unsigned_long_long>
              (this_01,(unsigned_long_long ***)arr2D,(int)((ulong)this_00 >> 0x20),(int)this_00);
    for (local_28c = 0; local_28c < in_RDI->n_KT; local_28c = local_28c + 1) {
      for (local_290 = 0; local_290 < in_RDI->n_Kphi; local_290 = local_290 + 1) {
        in_RDI->number_of_pairs_numerator_KTKphidiff[local_28c][local_290] = 0;
        in_RDI->number_of_pairs_denormenator_KTKphidiff[local_28c][local_290] = 0;
      }
    }
  }
  in_RDI->number_pairs_num = 0;
  in_RDI->number_pairs_denorm = 0;
  in_RDI->psi_ref = 0.0;
  if (in_RDI->invariant_radius_flag_ == 1) {
    create_a_2D_array<double>(this_01,(double ***)arr2D,(int)((ulong)this_00 >> 0x20),(int)this_00);
    create_a_2D_array<double>(this_01,(double ***)arr2D,(int)((ulong)this_00 >> 0x20),(int)this_00);
    create_a_2D_array<double>(this_01,(double ***)arr2D,(int)((ulong)this_00 >> 0x20),(int)this_00);
    create_a_2D_array<double>(this_01,(double ***)arr2D,(int)((ulong)this_00 >> 0x20),(int)this_00);
    for (local_294 = 0; local_294 < in_RDI->n_KT; local_294 = local_294 + 1) {
      for (local_298 = 0; local_298 < in_RDI->qnpts; local_298 = local_298 + 1) {
        in_RDI->q_inv_mean[local_294][local_298] = 0.0;
        in_RDI->correl_1d_inv_num[local_294][local_298] = 0.0;
        in_RDI->correl_1d_inv_num_count[local_294][local_298] = 0.0;
        in_RDI->correl_1d_inv_denorm[local_294][local_298] = 0.0;
      }
    }
  }
  n3 = (int)((ulong)arr2D >> 0x20);
  n1 = (int)((ulong)this_01 >> 0x20);
  if (in_RDI->azimuthal_flag_ == 0) {
    create_a_4D_array<double>(this_02,(double *****)arr5D,n1,(int)this_01,n3,(int)arr2D);
    create_a_4D_array<double>
              (this_02,(double *****)arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,
               (int)((ulong)arr2D >> 0x20),(int)arr2D);
    create_a_4D_array<double>
              (this_02,(double *****)arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,
               (int)((ulong)arr2D >> 0x20),(int)arr2D);
    create_a_4D_array<double>
              (this_02,(double *****)arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,
               (int)((ulong)arr2D >> 0x20),(int)arr2D);
    create_a_4D_array<double>
              (this_02,(double *****)arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,
               (int)((ulong)arr2D >> 0x20),(int)arr2D);
    create_a_4D_array<double>
              (this_02,(double *****)arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,
               (int)((ulong)arr2D >> 0x20),(int)arr2D);
    for (local_29c = 0; local_29c < in_RDI->n_KT; local_29c = local_29c + 1) {
      for (local_2a0 = 0; local_2a0 < in_RDI->qnpts; local_2a0 = local_2a0 + 1) {
        for (local_2a4 = 0; local_2a4 < in_RDI->qnpts; local_2a4 = local_2a4 + 1) {
          for (local_2a8 = 0; local_2a8 < in_RDI->qnpts; local_2a8 = local_2a8 + 1) {
            in_RDI->q_out_mean[local_29c][local_2a0][local_2a4][local_2a8] = 0.0;
            in_RDI->q_side_mean[local_29c][local_2a0][local_2a4][local_2a8] = 0.0;
            in_RDI->q_long_mean[local_29c][local_2a0][local_2a4][local_2a8] = 0.0;
            in_RDI->correl_3d_num[local_29c][local_2a0][local_2a4][local_2a8] = 0.0;
            in_RDI->correl_3d_num_count[local_29c][local_2a0][local_2a4][local_2a8] = 0.0;
            in_RDI->correl_3d_denorm[local_29c][local_2a0][local_2a4][local_2a8] = 0.0;
          }
        }
      }
    }
  }
  else {
    create_a_5D_array<double>(this_02,arr5D,n1,(int)this_01,n3,(int)arr2D,n5);
    create_a_5D_array<double>
              (this_02,arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)arr2D >> 0x20),
               (int)arr2D,n5);
    create_a_5D_array<double>
              (this_02,arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)arr2D >> 0x20),
               (int)arr2D,n5);
    create_a_5D_array<double>
              (this_02,arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)arr2D >> 0x20),
               (int)arr2D,n5);
    create_a_5D_array<double>
              (this_02,arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)arr2D >> 0x20),
               (int)arr2D,n5);
    create_a_5D_array<double>
              (this_02,arr5D,(int)((ulong)this_01 >> 0x20),(int)this_01,(int)((ulong)arr2D >> 0x20),
               (int)arr2D,n5);
    for (local_2ac = 0; local_2ac < in_RDI->n_KT; local_2ac = local_2ac + 1) {
      for (local_2b0 = 0; local_2b0 < in_RDI->n_Kphi; local_2b0 = local_2b0 + 1) {
        for (local_2b4 = 0; local_2b4 < in_RDI->qnpts; local_2b4 = local_2b4 + 1) {
          for (local_2b8 = 0; local_2b8 < in_RDI->qnpts; local_2b8 = local_2b8 + 1) {
            for (local_2bc = 0; local_2bc < in_RDI->qnpts; local_2bc = local_2bc + 1) {
              in_RDI->q_out_diff_mean[local_2ac][local_2b0][local_2b4][local_2b8][local_2bc] = 0.0;
              in_RDI->q_side_diff_mean[local_2ac][local_2b0][local_2b4][local_2b8][local_2bc] = 0.0;
              in_RDI->q_long_diff_mean[local_2ac][local_2b0][local_2b4][local_2b8][local_2bc] = 0.0;
              in_RDI->correl_3d_Kphi_diff_num[local_2ac][local_2b0][local_2b4][local_2b8][local_2bc]
                   = 0.0;
              in_RDI->correl_3d_Kphi_diff_num_count[local_2ac][local_2b0][local_2b4][local_2b8]
              [local_2bc] = 0.0;
              in_RDI->correl_3d_Kphi_diff_denorm[local_2ac][local_2b0][local_2b4][local_2b8]
              [local_2bc] = 0.0;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

HBT_correlation::HBT_correlation(
    ParameterReader &paraRdr, std::string path,
    std::shared_ptr<RandomUtil::Random> ran_gen)
    : paraRdr_(paraRdr), path_(path) {
    ran_gen_ptr_ = ran_gen;

    long_comoving_boost = false;
    if (paraRdr_.getVal("long_comoving_boost") == 1) long_comoving_boost = true;

    qnpts = paraRdr_.getVal("qnpts");
    q_min = paraRdr_.getVal("q_min");
    q_max = paraRdr_.getVal("q_max");
    delta_q = (q_max - q_min) / (qnpts - 1);

    for (int i = 0; i < qnpts; i++) {
        q_out.push_back(q_min + i * delta_q);
        q_side.push_back(q_min + i * delta_q);
        q_long.push_back(q_min + i * delta_q);
    }

    needed_number_of_pairs = paraRdr_.getVal("needed_number_of_pairs");

    azimuthal_flag_ = paraRdr_.getVal("azimuthal_flag");
    invariant_radius_flag_ = paraRdr_.getVal("invariant_radius_flag");

    n_KT = paraRdr_.getVal("n_KT");
    n_Kphi = paraRdr_.getVal("n_Kphi");
    KT_min = paraRdr_.getVal("KT_min");
    KT_max = paraRdr_.getVal("KT_max");
    Krap_min_ = paraRdr_.getVal("HBTrap_min");
    Krap_max_ = paraRdr_.getVal("HBTrap_max");

    dKT = (KT_max - KT_min) / (n_KT - 1);
    dKphi = 2 * M_PI / n_Kphi;  // does not need 0 and 2*pi

    for (int i = 0; i < n_KT; i++) {
        KT_array_.push_back(KT_min + i * dKT);
        number_of_pairs_numerator_KTdiff.push_back(0);
        number_of_pairs_denormenator_KTdiff.push_back(0);
        number_of_pairs_numerator_KTdiff_qinv_.push_back(0);
        number_of_pairs_denormenator_KTdiff_qinv_.push_back(0);
    }

    for (int i = 0; i < n_Kphi; i++) {
        Kphi_array_.push_back(i * dKphi);
    }

    if (azimuthal_flag_ == 1) {
        create_a_2D_array(number_of_pairs_numerator_KTKphidiff, n_KT, n_Kphi);
        create_a_2D_array(
            number_of_pairs_denormenator_KTKphidiff, n_KT, n_Kphi);
        for (int i = 0; i < n_KT; i++) {
            for (int j = 0; j < n_Kphi; j++) {
                number_of_pairs_numerator_KTKphidiff[i][j] = 0;
                number_of_pairs_denormenator_KTKphidiff[i][j] = 0;
            }
        }
    }

    number_pairs_num = 0;
    number_pairs_denorm = 0;
    psi_ref = 0.;

    if (invariant_radius_flag_ == 1) {
        create_a_2D_array(q_inv_mean, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_num, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_num_count, n_KT, qnpts);
        create_a_2D_array(correl_1d_inv_denorm, n_KT, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int k = 0; k < qnpts; k++) {
                q_inv_mean[iK][k] = 0.0;
                correl_1d_inv_num[iK][k] = 0.0;
                correl_1d_inv_num_count[iK][k] = 0.0;
                correl_1d_inv_denorm[iK][k] = 0.0;
            }
        }
    }

    if (azimuthal_flag_ == 0) {
        create_a_4D_array(q_out_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(q_side_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(q_long_mean, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_num, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_num_count, n_KT, qnpts, qnpts, qnpts);
        create_a_4D_array(correl_3d_denorm, n_KT, qnpts, qnpts, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int i = 0; i < qnpts; i++) {
                for (int j = 0; j < qnpts; j++) {
                    for (int k = 0; k < qnpts; k++) {
                        q_out_mean[iK][i][j][k] = 0.0;
                        q_side_mean[iK][i][j][k] = 0.0;
                        q_long_mean[iK][i][j][k] = 0.0;
                        correl_3d_num[iK][i][j][k] = 0.0;
                        correl_3d_num_count[iK][i][j][k] = 0.0;
                        correl_3d_denorm[iK][i][j][k] = 0.0;
                    }
                }
            }
        }
    } else {
        create_a_5D_array(q_out_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(q_side_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(q_long_diff_mean, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_num, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_num_count, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        create_a_5D_array(
            correl_3d_Kphi_diff_denorm, n_KT, n_Kphi, qnpts, qnpts, qnpts);
        for (int iK = 0; iK < n_KT; iK++) {
            for (int iphi = 0; iphi < n_Kphi; iphi++) {
                for (int i = 0; i < qnpts; i++) {
                    for (int j = 0; j < qnpts; j++) {
                        for (int k = 0; k < qnpts; k++) {
                            q_out_diff_mean[iK][iphi][i][j][k] = 0.0;
                            q_side_diff_mean[iK][iphi][i][j][k] = 0.0;
                            q_long_diff_mean[iK][iphi][i][j][k] = 0.0;
                            correl_3d_Kphi_diff_num[iK][iphi][i][j][k] = 0.0;
                            correl_3d_Kphi_diff_num_count[iK][iphi][i][j][k] =
                                0.0;
                            correl_3d_Kphi_diff_denorm[iK][iphi][i][j][k] = 0.0;
                        }
                    }
                }
            }
        }
    }
}